

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O2

int __thiscall CharFieldSourceByteArray::arraylen(CharFieldSourceByteArray *this,CVmPackType *t)

{
  wchar_t wVar1;
  uchar uVar2;
  int iVar3;
  unsigned_long i;
  ulong idx;
  
  wVar1 = t->type_code;
  if ((uint)(wVar1 + L'\xffffff9f') < 2) {
LAB_0026aaac:
    return (int)this->len;
  }
  if (wVar1 == L'w') {
LAB_0026aaf3:
    iVar3 = (int)this->len << (t->count_in_bytes != 0);
  }
  else {
    if (wVar1 == L'H') {
LAB_0026aab2:
      if (t->count_in_bytes != 0) {
        return (int)(this->len + 1 >> 1);
      }
      return (int)this->len;
    }
    if (wVar1 != L'U') {
      if (wVar1 == L'W') goto LAB_0026aaf3;
      if (wVar1 == L'h') goto LAB_0026aab2;
      if (wVar1 != L'u') {
        if (wVar1 != L'A') {
          return 0;
        }
        goto LAB_0026aaac;
      }
    }
    iVar3 = 0;
    for (idx = 1; idx <= this->len; idx = idx + 1) {
      uVar2 = CVmObjByteArray::get_element(this->arr,idx);
      iVar3 = (iVar3 - (uint)(-1 < (char)uVar2)) + 2;
    }
  }
  return iVar3;
}

Assistant:

virtual int arraylen(CVmPackType *t)
    {
        switch (t->type_code)
        {
        case 'a':
        case 'A':
        case 'b':
            /* 
             *   the length is in bytes, and we write one byte per character;
             *   we treat each byte in the array as a Latin-1 character, so
             *   this is the same as our array length 
             */
            return (int)len;

        case 'w':
        case 'W':
            /* 
             *   The length is in characters, or two bytes per character.  We
             *   treat our bytes as latin-1 characters, so the character
             *   count is the saqme as the array length. 
             */
            return (int)(t->count_in_bytes ? len*2 : len);
            
        case 'h':
        case 'H':
            /* 
             *   one character per array element, or one byte per pair of
             *   array elements 
             */
            return (int)(t->count_in_bytes ? (len+1)/2 : len);

        case 'u':
        case 'U':
            /* 
             *   The length is in bytes, in UTF-8 format.  We treat our array
             *   elements as Latin-1 characters.  In UTF-8, characters in the
             *   range 0-127 take one byte, and 128-255 take two bytes.  Run
             *   through our array and add up the required lengths.  
             */
            {
                int ret;
                unsigned long i;
                for (ret = 0, i = 1 ; i <= len ; ++i)
                    ret += arr->get_element(i) < 128 ? 1 : 2;

                /* return the length */
                return ret;
            }

        default:
            return 0;
        }
    }